

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O3

string * tao::pegtl::internal::demangle<queryparse::character>(void)

{
  char *__s;
  string *in_RDI;
  
  __s = (char *)__cxa_demangle("N10queryparse9characterE",0,0,0);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
    free(__s);
  }
  return in_RDI;
}

Assistant:

std::string demangle()
         {
            return demangle( typeid( T ).name() );
         }